

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O3

CURLcode get_libcurl_info(void)

{
  char **ppcVar1;
  int iVar2;
  curl_version_info_data *pcVar3;
  char **cpp;
  char **ppcVar4;
  feature_name_presentp *pfVar5;
  CURLcode CVar6;
  char *pcVar7;
  proto_name_tokenp *ppVar8;
  
  curlinfo = (curl_version_info_data *)curl_version_info(0xb);
  if (curlinfo == (curl_version_info_data *)0x0) {
    CVar6 = CURLE_FAILED_INIT;
  }
  else {
    ppcVar4 = curlinfo->protocols;
    if (ppcVar4 != (char **)0x0) {
      pcVar7 = *ppcVar4;
      built_in_protos = ppcVar4;
      while (pcVar7 != (char *)0x0) {
        ppVar8 = possibly_built_in;
        pcVar7 = "file";
        do {
          ppVar8 = ppVar8 + 1;
          iVar2 = curl_strequal(pcVar7,*ppcVar4);
          if (iVar2 != 0) {
            *ppVar8[-1].proto_tokenp = *ppcVar4;
            break;
          }
          pcVar7 = ppVar8->proto_name;
        } while (pcVar7 != (char *)0x0);
        pcVar7 = ppcVar4[1];
        ppcVar4 = ppcVar4 + 1;
      }
      proto_count = (long)ppcVar4 - (long)built_in_protos >> 3;
    }
    if ((curlinfo->age < CURLVERSION_ELEVENTH) ||
       (ppcVar4 = curlinfo->feature_names, curlinfo->feature_names == (char **)0x0)) {
      ppcVar4 = fnames;
      pcVar7 = "alt-svc";
      pfVar5 = maybe_feature;
      pcVar3 = curlinfo;
      do {
        pfVar5 = pfVar5 + 1;
        if ((pcVar3->features & pfVar5[-1].feature_bitmask) != 0) {
          *ppcVar4 = pcVar7;
          ppcVar4 = ppcVar4 + 1;
          pcVar3 = curlinfo;
        }
        pcVar7 = pfVar5->feature_name;
      } while (pcVar7 != (char *)0x0);
      *ppcVar4 = (char *)0x0;
      ppcVar4 = feature_names;
    }
    feature_names = ppcVar4;
    pcVar7 = *feature_names;
    ppcVar4 = feature_names;
    while (CVar6 = CURLE_OK, pcVar7 != (char *)0x0) {
      pfVar5 = maybe_feature;
      pcVar7 = "alt-svc";
      do {
        pfVar5 = pfVar5 + 1;
        iVar2 = curl_strequal(pcVar7,*ppcVar4);
        if (iVar2 != 0) {
          if (pfVar5[-1].feature_presentp != (_Bool *)0x0) {
            *pfVar5[-1].feature_presentp = true;
          }
          break;
        }
        pcVar7 = pfVar5->feature_name;
      } while (pcVar7 != (char *)0x0);
      feature_count = feature_count + 1;
      ppcVar1 = ppcVar4 + 1;
      ppcVar4 = ppcVar4 + 1;
      pcVar7 = *ppcVar1;
    }
  }
  return CVar6;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  CURLcode result = CURLE_OK;
  const char *const *builtin;

  /* Pointer to libcurl's runtime version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  if(curlinfo->protocols) {
    const struct proto_name_tokenp *p;

    built_in_protos = curlinfo->protocols;

    for(builtin = built_in_protos; !result && *builtin; builtin++) {
      /* Identify protocols we are interested in. */
      for(p = possibly_built_in; p->proto_name; p++)
        if(curl_strequal(p->proto_name, *builtin)) {
          *p->proto_tokenp = *builtin;
          break;
        }
    }
    proto_count = builtin - built_in_protos;
  }

  if(curlinfo->age >= CURLVERSION_ELEVENTH && curlinfo->feature_names)
    feature_names = curlinfo->feature_names;
  else {
    const struct feature_name_presentp *p;
    const char **cpp = fnames;

    for(p = maybe_feature; p->feature_name; p++)
      if(curlinfo->features & p->feature_bitmask)
        *cpp++ = p->feature_name;
    *cpp = NULL;
  }

  /* Identify features we are interested in. */
  for(builtin = feature_names; *builtin; builtin++) {
    const struct feature_name_presentp *p;

    for(p = maybe_feature; p->feature_name; p++)
      if(curl_strequal(p->feature_name, *builtin)) {
        if(p->feature_presentp)
          *p->feature_presentp = TRUE;
        break;
      }
    ++feature_count;
  }

  return CURLE_OK;
}